

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ba9::DataDump<long_double>::~DataDump(DataDump<long_double> *this)

{
  DataDump<long_double> *in_RDI;
  
  ~DataDump(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~DataDump() override {
  }